

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

bool bsim::operator>(quad_value_bit_vector *a,quad_value_bit_vector *b)

{
  bool bVar1;
  int iVar2;
  quad_value_bit_vector *in_RSI;
  quad_value_bit_vector *in_RDI;
  int i;
  int N;
  undefined4 in_stack_ffffffffffffffd8;
  quad_value in_stack_ffffffffffffffdc;
  quad_value in_stack_ffffffffffffffdd;
  quad_value in_stack_ffffffffffffffde;
  quad_value in_stack_ffffffffffffffdf;
  int iVar3;
  
  bVar1 = quad_value_bit_vector::is_binary(in_RSI);
  if ((bVar1) && (bVar1 = quad_value_bit_vector::is_binary(in_RSI), bVar1)) {
    iVar2 = quad_value_bit_vector::bitLength(in_RDI);
    iVar3 = iVar2;
    do {
      iVar3 = iVar3 + -1;
      if (iVar3 < 0) {
        return false;
      }
      in_stack_ffffffffffffffdf =
           quad_value_bit_vector::get
                     ((quad_value_bit_vector *)
                      CONCAT17(in_stack_ffffffffffffffdf.value,
                               CONCAT16(in_stack_ffffffffffffffde.value,
                                        CONCAT15(in_stack_ffffffffffffffdd.value,
                                                 CONCAT14(in_stack_ffffffffffffffdc.value,
                                                          in_stack_ffffffffffffffd8)))),0);
      in_stack_ffffffffffffffde =
           quad_value_bit_vector::get
                     ((quad_value_bit_vector *)
                      CONCAT17(in_stack_ffffffffffffffdf.value,
                               CONCAT16(in_stack_ffffffffffffffde.value,
                                        CONCAT15(in_stack_ffffffffffffffdd.value,
                                                 CONCAT14(in_stack_ffffffffffffffdc.value,
                                                          in_stack_ffffffffffffffd8)))),0);
      bVar1 = operator>((quad_value *)CONCAT44(iVar2,iVar3),
                        (quad_value *)
                        CONCAT17(in_stack_ffffffffffffffdf.value,
                                 CONCAT16(in_stack_ffffffffffffffde.value,
                                          CONCAT15(in_stack_ffffffffffffffdd.value,
                                                   CONCAT14(in_stack_ffffffffffffffdc.value,
                                                            in_stack_ffffffffffffffd8)))));
      if (bVar1) {
        return true;
      }
      in_stack_ffffffffffffffdd =
           quad_value_bit_vector::get
                     ((quad_value_bit_vector *)
                      CONCAT17(in_stack_ffffffffffffffdf.value,
                               CONCAT16(in_stack_ffffffffffffffde.value,
                                        CONCAT15(in_stack_ffffffffffffffdd.value,
                                                 CONCAT14(in_stack_ffffffffffffffdc.value,
                                                          in_stack_ffffffffffffffd8)))),0);
      in_stack_ffffffffffffffdc =
           quad_value_bit_vector::get
                     ((quad_value_bit_vector *)
                      CONCAT17(in_stack_ffffffffffffffdf.value,
                               CONCAT16(in_stack_ffffffffffffffde.value,
                                        CONCAT15(in_stack_ffffffffffffffdd.value,
                                                 CONCAT14(in_stack_ffffffffffffffdc.value,
                                                          in_stack_ffffffffffffffd8)))),0);
      bVar1 = operator<((quad_value *)CONCAT44(iVar2,iVar3),
                        (quad_value *)
                        CONCAT17(in_stack_ffffffffffffffdf.value,
                                 CONCAT16(in_stack_ffffffffffffffde.value,
                                          CONCAT15(in_stack_ffffffffffffffdd.value,
                                                   CONCAT14(in_stack_ffffffffffffffdc.value,
                                                            in_stack_ffffffffffffffd8)))));
    } while (!bVar1);
  }
  return false;
}

Assistant:

static inline bool operator>(const quad_value_bit_vector& a,
  			       const quad_value_bit_vector& b) {
    if (!a.is_binary() || !b.is_binary()) {
      return false;
    }

    int N = a.bitLength();
    for (int i = N - 1; i >= 0; i--) {
      if (a.get(i) > b.get(i)) {
  	return true;
      }

      if (a.get(i) < b.get(i)) {
  	return false;
      }
    }

    return false;
  }